

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O3

void do_cmd_throw(command *cmd)

{
  int iVar1;
  player_body *ppVar2;
  char *pcVar3;
  player_body body;
  _Bool _Var4;
  int16_t iVar5;
  wchar_t wVar6;
  wchar_t range;
  int iVar7;
  object *obj;
  wchar_t dir;
  undefined4 uVar8;
  undefined4 uVar9;
  object *local_28;
  wchar_t local_1c;
  
  iVar1 = adj_str_blow[(player->state).stat_ind[0]];
  _Var4 = player_get_resume_normal_shape(player,cmd);
  if (_Var4) {
    if (player->upkeep->command_wrk == L'\x01') {
      player->upkeep->command_wrk = L'\x02';
    }
    wVar6 = cmd_get_item((command_conflict *)cmd,"item",&local_28,"Throw which item?",
                         "You have nothing to throw.",obj_can_throw,L'ࠏ');
    if (wVar6 == L'\0') {
      wVar6 = cmd_get_target((command_conflict *)cmd,"target",&local_1c);
      if (wVar6 == L'\0') {
        player_confuse_dir(player,&local_1c,false);
        ppVar2 = (player->body).next;
        pcVar3 = (player->body).name;
        uVar8 = SUB84(ppVar2,0);
        uVar9 = (undefined4)((ulong)ppVar2 >> 0x20);
        wVar6 = (wchar_t)pcVar3;
        body.name._4_4_ = (int)((ulong)pcVar3 >> 0x20);
        body._0_12_ = *(undefined1 (*) [12])&player->body;
        body.count = (player->body).count;
        body._18_6_ = *(undefined6 *)&(player->body).field_0x12;
        body.slots = (player->body).slots;
        _Var4 = object_is_equipped(body,local_28);
        if (_Var4) {
          _Var4 = obj_can_takeoff(local_28);
          if (!_Var4) {
LAB_001a00de:
            __assert_fail("obj_can_takeoff(obj) && tval_is_melee_weapon(obj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-attack.c"
                          ,0x576,"void do_cmd_throw(struct command *)");
          }
          _Var4 = tval_is_melee_weapon(local_28);
          if (!_Var4) goto LAB_001a00de;
          inven_takeoff(local_28);
        }
        iVar5 = object_weight_one(local_28);
        iVar7 = 10;
        if (9 < iVar5) {
          iVar5 = object_weight_one(local_28);
          iVar7 = (int)iVar5;
        }
        range = (iVar1 * 10 + 200) / iVar7;
        if (L'\t' < range) {
          range = L'\n';
        }
        ranged_helper(player,local_28,local_1c,range,L'\n',make_ranged_throw,
                      (hit_types *)CONCAT44(uVar9,uVar8),wVar6);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_throw(struct command *cmd) {
	int dir;
	int shots = 10;
	int str = adj_str_blow[player->state.stat_ind[STAT_STR]];
	ranged_attack attack = make_ranged_throw;

	int weight;
	int range;
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/*
	 * Get arguments.  Never default to showing the equipment as the first
	 * list (since throwing the equipped weapon leaves that slot empty will
	 * have to choose another source anyways).
	 */
	if (player->upkeep->command_wrk == USE_EQUIP)
		player->upkeep->command_wrk = USE_INVEN;
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Throw which item?",
			/* Error  */ "You have nothing to throw.",
			/* Filter */ obj_can_throw,
			/* Choice */ USE_EQUIP | USE_QUIVER | USE_INVEN | USE_FLOOR | SHOW_THROWING)
		!= CMD_OK)
		return;

	if (cmd_get_target(cmd, "target", &dir) == CMD_OK)
		player_confuse_dir(player, &dir, false);
	else
		return;

	if (object_is_equipped(player->body, obj)) {
		assert(obj_can_takeoff(obj) && tval_is_melee_weapon(obj));
		inven_takeoff(obj);
	}

	weight = MAX(object_weight_one(obj), 10);
	range = MIN(((str + 20) * 10) / weight, 10);

	ranged_helper(player, obj, dir, range, shots, attack, ranged_hit_types,
				  (int) N_ELEMENTS(ranged_hit_types));
}